

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_bool nk_do_button_text_image
                  (nk_flags *state,nk_command_buffer *out,nk_rect bounds,nk_image img,char *str,
                  int len,nk_flags align,nk_button_behavior behavior,nk_style_button *style,
                  nk_user_font *font,nk_input *in)

{
  nk_vec2 nVar1;
  uint state_00;
  undefined4 in_EAX;
  int iVar2;
  nk_bool nVar3;
  nk_style_item *pnVar4;
  nk_color *pnVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  undefined1 auVar17 [16];
  nk_rect r;
  nk_rect content;
  nk_rect local_a8;
  nk_text local_98;
  undefined1 local_88 [8];
  float fStack_80;
  float fStack_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  nk_rect local_68;
  undefined8 local_58;
  undefined8 uStack_50;
  nk_vec2 local_48;
  undefined8 uStack_40;
  
  auVar17._0_4_ = -(uint)(out == (nk_command_buffer *)0x0);
  auVar17._4_4_ = -(uint)(font == (nk_user_font *)0x0);
  auVar17._8_4_ = -(uint)(style == (nk_style_button *)0x0);
  auVar17._12_4_ = -(uint)(str == (char *)0x0);
  iVar2 = movmskps(in_EAX,auVar17);
  nVar3 = 0;
  if (iVar2 == 0) {
    local_a8 = bounds;
    nVar3 = nk_do_button(state,out,bounds,style,in,behavior,&local_68);
    fVar6 = (style->padding).y;
    local_78 = local_a8.h - (fVar6 + fVar6);
    if ((align & 1) == 0) {
      fVar7 = (style->padding).x;
      fVar7 = fVar7 + fVar7 + local_a8.x;
    }
    else {
      fVar7 = (style->padding).x;
      fVar9 = (local_a8.x + local_a8.w) - (fVar7 + fVar7 + local_78);
      fVar7 = 0.0;
      if (0.0 <= fVar9) {
        fVar7 = fVar9;
      }
    }
    local_88._4_4_ = local_a8.y + fVar6;
    local_88._0_4_ = fVar7;
    register0x00001288 = 0;
    nVar1 = style->image_padding;
    fVar6 = nVar1.x;
    fVar7 = nVar1.y;
    fVar9 = 0.0;
    fVar8 = 0.0;
    fVar10 = fVar6 + fVar6;
    fVar11 = fVar7 + fVar7;
    fVar12 = 0.0;
    fVar13 = 0.0;
    fStack_74 = local_78;
    fStack_70 = local_78;
    fStack_6c = local_78;
    if (style->draw_begin != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      uStack_40 = 0;
      local_58 = CONCAT44(fVar7 + fVar7,fVar6 + fVar6);
      uStack_50 = 0;
      local_48 = nVar1;
      (*style->draw_begin)(out,(nk_handle)(style->userdata).ptr);
      fVar6 = local_48.x;
      fVar7 = local_48.y;
      fVar9 = (float)uStack_40;
      fVar8 = uStack_40._4_4_;
      fVar10 = (float)local_58;
      fVar11 = local_58._4_4_;
      fVar12 = (float)uStack_50;
      fVar13 = uStack_50._4_4_;
    }
    fVar14 = local_88._0_4_;
    fVar15 = local_88._8_4_;
    fVar16 = local_88._12_4_;
    local_88._4_4_ = local_88._4_4_ + fVar7;
    local_88._0_4_ = fVar14 + fVar6;
    fStack_80 = fVar15 + fVar9;
    fStack_7c = fVar16 + fVar8;
    local_78 = local_78 - fVar10;
    fStack_74 = fStack_74 - fVar11;
    fStack_70 = fStack_70 - fVar12;
    fStack_6c = fStack_6c - fVar13;
    state_00 = *state;
    pnVar4 = nk_draw_button(out,&local_a8,state_00,style);
    pnVar5 = &style->text_background;
    if (pnVar4->type == NK_STYLE_ITEM_COLOR) {
      pnVar5 = (nk_color *)&pnVar4->data;
    }
    local_98.background = *pnVar5;
    if ((state_00 & 0x10) == 0) {
      if ((state_00 & 0x20) == 0) {
        local_98.text = style->text_normal;
      }
      else {
        local_98.text = style->text_active;
      }
    }
    else {
      local_98.text = style->text_hover;
    }
    local_98.padding.x = 0.0;
    local_98.padding.y = 0.0;
    nk_widget_text(out,local_68,str,len,&local_98,0x12,font);
    auVar17 = _local_88;
    r.h = fStack_74;
    r.w = local_78;
    r.x = (float)local_88._0_4_;
    r.y = (float)local_88._4_4_;
    _local_88 = auVar17;
    nk_draw_image(out,r,&img,(nk_color)0xffffffff);
    if (style->draw_end != (_func_void_nk_command_buffer_ptr_nk_handle *)0x0) {
      (*style->draw_end)(out,(nk_handle)(style->userdata).ptr);
    }
  }
  return nVar3;
}

Assistant:

NK_LIB nk_bool
nk_do_button_text_image(nk_flags *state,
struct nk_command_buffer *out, struct nk_rect bounds,
struct nk_image img, const char* str, int len, nk_flags align,
enum nk_button_behavior behavior, const struct nk_style_button *style,
const struct nk_user_font *font, const struct nk_input *in)
{
int ret;
struct nk_rect icon;
struct nk_rect content;

NK_ASSERT(style);
NK_ASSERT(state);
NK_ASSERT(font);
NK_ASSERT(out);
if (!out || !font || !style || !str)
return nk_false;

ret = nk_do_button(state, out, bounds, style, in, behavior, &content);
icon.y = bounds.y + style->padding.y;
icon.w = icon.h = bounds.h - 2 * style->padding.y;
if (align & NK_TEXT_ALIGN_LEFT) {
icon.x = (bounds.x + bounds.w) - (2 * style->padding.x + icon.w);
icon.x = NK_MAX(icon.x, 0);
} else icon.x = bounds.x + 2 * style->padding.x;

icon.x += style->image_padding.x;
icon.y += style->image_padding.y;
icon.w -= 2 * style->image_padding.x;
icon.h -= 2 * style->image_padding.y;

if (style->draw_begin) style->draw_begin(out, style->userdata);
nk_draw_button_text_image(out, &bounds, &content, &icon, *state, style, str, len, font, &img);
if (style->draw_end) style->draw_end(out, style->userdata);
return ret;
}